

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O1

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  char *pcVar1;
  size_t *psVar2;
  long *******ppppppplVar3;
  pointer pcVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint uVar25;
  long ******pppppplVar26;
  aiMesh *paVar27;
  aiVector3D *paVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  list<aiNode_*,_std::allocator<aiNode_*>_> *plVar35;
  int iVar36;
  aiNode **tmp;
  size_t sVar37;
  iterator iVar38;
  _List_node_base *p_Var39;
  _List_node_base *p_Var40;
  _List_node_base *p_Var41;
  long *******ppppppplVar42;
  _List_node_base *p_Var43;
  aiNode **ppaVar44;
  long *******ppppppplVar45;
  long lVar46;
  ulong uVar47;
  aiNode *paVar48;
  ulong uVar49;
  OptimizeGraphProcess *pOVar50;
  int iVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  list<aiNode_*,_std::allocator<aiNode_*>_> local_100;
  OptimizeGraphProcess *local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8 [16];
  LockedSetType *local_c0;
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  float local_90;
  float local_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float local_7c;
  long *******local_78;
  long *******local_70;
  long local_68;
  list<aiNode_*,_std::allocator<aiNode_*>_> *local_60;
  key_type local_58;
  aiNode *local_38;
  
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_100;
  local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_100;
  local_60 = nodes;
  if (nd->mNumChildren != 0) {
    uVar49 = 0;
    do {
      CollectNewChildren(this,nd->mChildren[uVar49],&local_100);
      nd->mChildren[uVar49] = (aiNode *)0x0;
      uVar49 = uVar49 + 1;
    } while (uVar49 < nd->mNumChildren);
  }
  pcVar1 = (nd->mName).data;
  pcVar4 = local_b8 + 0x10;
  local_b8._0_8_ = pcVar4;
  sVar37 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,pcVar1,(nd->mName).data + sVar37);
  local_c0 = &this->locked;
  iVar38 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_c0->_M_t,(key_type *)local_b8);
  local_e0 = &(this->locked)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8 = this;
  if ((pointer)local_b8._0_8_ != pcVar4) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (iVar38._M_node == local_e0) {
    if (local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_100) {
      p_Var39 = local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      do {
        p_Var41 = p_Var39[1]._M_next;
        pcVar1 = (char *)((long)&p_Var41->_M_next + 4);
        local_b8._0_8_ = pcVar4;
        sVar37 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,pcVar1,(long)&p_Var41->_M_next + sVar37 + 4);
        iVar38 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_c0->_M_t,(key_type *)local_b8);
        if ((pointer)local_b8._0_8_ != pcVar4) {
          operator_delete((void *)local_b8._0_8_);
        }
        if (iVar38._M_node == local_e0) {
          p_Var41 = p_Var39[1]._M_next;
          fVar5 = (nd->mTransformation).a1;
          fVar6 = (nd->mTransformation).a2;
          fVar7 = (nd->mTransformation).a3;
          fVar8 = (nd->mTransformation).a4;
          fVar9 = *(float *)((long)&p_Var41[0x41]._M_next + 4);
          fVar10 = *(float *)((long)&p_Var41[0x40]._M_next + 4);
          fVar11 = *(float *)&p_Var41[0x40]._M_prev;
          local_d8._0_4_ = fVar11;
          fVar12 = *(float *)((long)&p_Var41[0x42]._M_next + 4);
          fVar53 = *(float *)((long)&p_Var41[0x43]._M_next + 4);
          fVar54 = *(float *)&p_Var41[0x41]._M_prev;
          fVar55 = *(float *)&p_Var41[0x42]._M_prev;
          fVar64 = *(float *)&p_Var41[0x43]._M_prev;
          fVar56 = *(float *)((long)&p_Var41[0x41]._M_prev + 4);
          fVar57 = *(float *)((long)&p_Var41[0x40]._M_prev + 4);
          fVar58 = *(float *)((long)&p_Var41[0x42]._M_prev + 4);
          fVar59 = *(float *)((long)&p_Var41[0x43]._M_prev + 4);
          fVar60 = *(float *)&p_Var41[0x42]._M_next;
          fVar61 = *(float *)&p_Var41[0x41]._M_next;
          fVar62 = *(float *)&p_Var41[0x43]._M_next;
          fVar63 = *(float *)&p_Var41[0x44]._M_next;
          fVar13 = (nd->mTransformation).b2;
          fVar14 = (nd->mTransformation).b1;
          fVar15 = (nd->mTransformation).b3;
          fVar16 = (nd->mTransformation).b4;
          fVar17 = (nd->mTransformation).c2;
          fVar18 = (nd->mTransformation).c1;
          fVar19 = (nd->mTransformation).c3;
          fVar20 = (nd->mTransformation).c4;
          fVar21 = (nd->mTransformation).d2;
          fVar22 = (nd->mTransformation).d1;
          fVar23 = (nd->mTransformation).d3;
          fVar24 = (nd->mTransformation).d4;
          *(float *)((long)&p_Var41[0x40]._M_next + 4) =
               fVar53 * fVar8 + fVar12 * fVar7 + fVar10 * fVar5 + fVar6 * fVar9;
          *(float *)&p_Var41[0x40]._M_prev =
               fVar64 * fVar8 + fVar55 * fVar7 + fVar11 * fVar5 + fVar6 * fVar54;
          *(float *)((long)&p_Var41[0x40]._M_prev + 4) =
               fVar59 * fVar8 + fVar58 * fVar7 + fVar57 * fVar5 + fVar6 * fVar56;
          *(float *)&p_Var41[0x41]._M_next =
               fVar8 * fVar63 + fVar7 * fVar62 + fVar5 * fVar61 + fVar6 * fVar60;
          *(float *)((long)&p_Var41[0x41]._M_next + 4) =
               fVar53 * fVar16 + fVar12 * fVar15 + fVar10 * fVar14 + fVar13 * fVar9;
          *(float *)&p_Var41[0x41]._M_prev =
               fVar64 * fVar16 + fVar55 * fVar15 + fVar11 * fVar14 + fVar13 * fVar54;
          *(float *)((long)&p_Var41[0x41]._M_prev + 4) =
               fVar59 * fVar16 + fVar58 * fVar15 + fVar57 * fVar14 + fVar13 * fVar56;
          *(float *)&p_Var41[0x42]._M_next =
               fVar16 * fVar63 + fVar15 * fVar62 + fVar14 * fVar61 + fVar13 * fVar60;
          *(float *)((long)&p_Var41[0x42]._M_next + 4) =
               fVar53 * fVar20 + fVar12 * fVar19 + fVar10 * fVar18 + fVar17 * fVar9;
          *(float *)&p_Var41[0x42]._M_prev =
               fVar64 * fVar20 + fVar55 * fVar19 + fVar11 * fVar18 + fVar17 * fVar54;
          *(float *)((long)&p_Var41[0x42]._M_prev + 4) =
               fVar59 * fVar20 + fVar58 * fVar19 + fVar57 * fVar18 + fVar17 * fVar56;
          *(float *)&p_Var41[0x43]._M_next =
               fVar20 * fVar63 + fVar19 * fVar62 + fVar18 * fVar61 + fVar17 * fVar60;
          *(float *)((long)&p_Var41[0x43]._M_next + 4) =
               fVar53 * fVar24 + fVar12 * fVar23 + fVar10 * fVar22 + fVar9 * fVar21;
          *(float *)&p_Var41[0x43]._M_prev =
               fVar64 * fVar24 + fVar55 * fVar23 + fVar11 * fVar22 + fVar54 * fVar21;
          *(float *)((long)&p_Var41[0x43]._M_prev + 4) =
               fVar59 * fVar24 + fVar58 * fVar23 + fVar57 * fVar22 + fVar56 * fVar21;
          *(float *)&p_Var41[0x44]._M_next =
               fVar63 * fVar24 + fVar62 * fVar23 + fVar61 * fVar22 + fVar21 * fVar60;
          p_Var41 = (_List_node_base *)operator_new(0x18);
          plVar35 = local_60;
          p_Var41[1]._M_next = p_Var39[1]._M_next;
          std::__detail::_List_node_base::_M_hook(p_Var41);
          psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node
                    ._M_size;
          *psVar2 = *psVar2 + 1;
          p_Var41 = p_Var39->_M_next;
          local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var39);
        }
        else {
          p_Var41 = p_Var39->_M_next;
        }
        p_Var39 = p_Var41;
      } while (p_Var41 != (_List_node_base *)&local_100);
    }
    pOVar50 = local_e8;
    if ((nd->mNumMeshes == 0) &&
       (local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_100)) {
      if (nd != (aiNode *)0x0) {
        aiNode::~aiNode(nd);
        operator_delete(nd);
      }
      goto LAB_00164d5a;
    }
    p_Var39 = (_List_node_base *)operator_new(0x18);
    plVar35 = local_60;
    p_Var39[1]._M_next = (_List_node_base *)nd;
    std::__detail::_List_node_base::_M_hook(p_Var39);
    psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    p_Var39 = (_List_node_base *)operator_new(0x18);
    plVar35 = local_60;
    p_Var39[1]._M_next = (_List_node_base *)nd;
    local_38 = nd;
    std::__detail::_List_node_base::_M_hook(p_Var39);
    psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
    local_b8._0_4_ = 1.0;
    local_b8._4_4_ = 0.0;
    local_b8._8_4_ = 0.0;
    local_b8._12_4_ = 0.0;
    local_b8._16_4_ = 0.0;
    local_b8._20_4_ = 1.0;
    local_b8._24_8_ = 0;
    uStack_98._0_4_ = 0.0;
    uStack_98._4_4_ = 0.0;
    local_90 = 1.0;
    local_8c = 0.0;
    fStack_88 = 0.0;
    fStack_84 = 0.0;
    fStack_80 = 0.0;
    local_7c = 1.0;
    local_78 = (long *******)&local_78;
    local_68 = 0;
    local_70 = local_78;
    if (local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_100) {
      p_Var39 = (_List_node_base *)0x0;
    }
    else {
      p_Var39 = (_List_node_base *)0x0;
      p_Var41 = local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      do {
        p_Var43 = p_Var41[1]._M_next;
        if (*(int *)&p_Var43[0x45]._M_next == 0) {
          pcVar1 = (char *)((long)&p_Var43->_M_next + 4);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          sVar37 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pcVar1,(long)&p_Var43->_M_next + sVar37 + 4);
          iVar38 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_c0->_M_t,&local_58);
          bVar52 = iVar38._M_node == local_e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        else {
          bVar52 = false;
        }
        if (bVar52) {
          uVar25 = *(uint *)&p_Var43[0x46]._M_next;
          if (uVar25 == 0) {
            uVar49 = 0;
          }
          else {
            uVar49 = 0;
            do {
              if (1 < (local_e8->meshes).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [*(uint *)((long)&(p_Var43[0x46]._M_prev)->_M_next + uVar49 * 4)])
              goto LAB_001638f6;
              uVar49 = uVar49 + 1;
            } while (uVar25 != (uint)uVar49);
            uVar49 = (ulong)uVar25;
          }
LAB_001638f6:
          bVar52 = true;
          p_Var40 = p_Var41;
          if ((uint)uVar49 == uVar25) {
            if (p_Var39 == (_List_node_base *)0x0) {
              uVar29 = *(undefined8 *)((long)&p_Var43[0x40]._M_next + 4);
              uVar30 = *(undefined8 *)((long)&p_Var43[0x40]._M_prev + 4);
              uVar31 = *(undefined8 *)((long)&p_Var43[0x41]._M_next + 4);
              local_b8._24_8_ = *(undefined8 *)((long)&p_Var43[0x41]._M_prev + 4);
              uStack_98 = *(undefined8 *)((long)&p_Var43[0x42]._M_next + 4);
              uVar32 = *(undefined8 *)((long)&p_Var43[0x42]._M_prev + 4);
              uVar33 = *(undefined8 *)((long)&p_Var43[0x43]._M_next + 4);
              uVar34 = *(undefined8 *)((long)&p_Var43[0x43]._M_prev + 4);
              fStack_88 = (float)uVar33;
              fStack_84 = (float)((ulong)uVar33 >> 0x20);
              fStack_80 = (float)uVar34;
              local_7c = (float)((ulong)uVar34 >> 0x20);
              local_90 = (float)uVar32;
              local_8c = (float)((ulong)uVar32 >> 0x20);
              local_b8._16_4_ = (undefined4)uVar31;
              local_b8._20_4_ = (undefined4)((ulong)uVar31 >> 0x20);
              local_b8._0_4_ = (undefined4)uVar29;
              local_b8._4_4_ = (undefined4)((ulong)uVar29 >> 0x20);
              local_b8._8_4_ = (undefined4)uVar30;
              local_b8._12_4_ = (undefined4)((ulong)uVar30 >> 0x20);
              aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_b8);
              p_Var39 = p_Var43;
            }
            else {
              fVar5 = *(float *)((long)&p_Var43[0x41]._M_next + 4);
              fVar6 = *(float *)((long)&p_Var43[0x40]._M_next + 4);
              fVar7 = *(float *)&p_Var43[0x40]._M_prev;
              local_d8._0_4_ = fVar7;
              fVar8 = *(float *)((long)&p_Var43[0x42]._M_next + 4);
              fVar9 = *(float *)((long)&p_Var43[0x43]._M_next + 4);
              fVar10 = *(float *)&p_Var43[0x41]._M_prev;
              fVar11 = *(float *)&p_Var43[0x42]._M_prev;
              fVar12 = *(float *)&p_Var43[0x43]._M_prev;
              fVar53 = *(float *)((long)&p_Var43[0x41]._M_prev + 4);
              fVar54 = *(float *)((long)&p_Var43[0x40]._M_prev + 4);
              fVar55 = *(float *)((long)&p_Var43[0x42]._M_prev + 4);
              fVar64 = *(float *)((long)&p_Var43[0x43]._M_prev + 4);
              fVar56 = *(float *)&p_Var43[0x42]._M_next;
              fVar57 = *(float *)&p_Var43[0x41]._M_next;
              fVar58 = *(float *)&p_Var43[0x43]._M_next;
              fVar59 = *(float *)&p_Var43[0x44]._M_next;
              *(float *)((long)&p_Var43[0x40]._M_next + 4) =
                   fVar9 * (float)local_b8._12_4_ +
                   fVar8 * (float)local_b8._8_4_ +
                   fVar6 * (float)local_b8._0_4_ + (float)local_b8._4_4_ * fVar5;
              *(float *)&p_Var43[0x40]._M_prev =
                   fVar12 * (float)local_b8._12_4_ +
                   fVar11 * (float)local_b8._8_4_ +
                   fVar7 * (float)local_b8._0_4_ + (float)local_b8._4_4_ * fVar10;
              *(float *)((long)&p_Var43[0x40]._M_prev + 4) =
                   fVar64 * (float)local_b8._12_4_ +
                   fVar55 * (float)local_b8._8_4_ +
                   fVar54 * (float)local_b8._0_4_ + (float)local_b8._4_4_ * fVar53;
              *(float *)&p_Var43[0x41]._M_next =
                   (float)local_b8._12_4_ * fVar59 +
                   (float)local_b8._8_4_ * fVar58 +
                   (float)local_b8._0_4_ * fVar57 + (float)local_b8._4_4_ * fVar56;
              *(float *)((long)&p_Var43[0x41]._M_next + 4) =
                   fVar9 * (float)local_b8._28_4_ +
                   fVar8 * (float)local_b8._24_4_ +
                   fVar6 * (float)local_b8._16_4_ + (float)local_b8._20_4_ * fVar5;
              *(float *)&p_Var43[0x41]._M_prev =
                   fVar12 * (float)local_b8._28_4_ +
                   fVar11 * (float)local_b8._24_4_ +
                   fVar7 * (float)local_b8._16_4_ + (float)local_b8._20_4_ * fVar10;
              *(float *)((long)&p_Var43[0x41]._M_prev + 4) =
                   fVar64 * (float)local_b8._28_4_ +
                   fVar55 * (float)local_b8._24_4_ +
                   fVar54 * (float)local_b8._16_4_ + (float)local_b8._20_4_ * fVar53;
              *(float *)&p_Var43[0x42]._M_next =
                   (float)local_b8._28_4_ * fVar59 +
                   (float)local_b8._24_4_ * fVar58 +
                   (float)local_b8._16_4_ * fVar57 + (float)local_b8._20_4_ * fVar56;
              *(float *)((long)&p_Var43[0x42]._M_next + 4) =
                   fVar9 * local_8c +
                   fVar8 * local_90 + fVar6 * (float)uStack_98 + uStack_98._4_4_ * fVar5;
              *(float *)&p_Var43[0x42]._M_prev =
                   fVar12 * local_8c +
                   fVar11 * local_90 + fVar7 * (float)uStack_98 + uStack_98._4_4_ * fVar10;
              *(float *)((long)&p_Var43[0x42]._M_prev + 4) =
                   fVar64 * local_8c +
                   fVar55 * local_90 + fVar54 * (float)uStack_98 + uStack_98._4_4_ * fVar53;
              *(float *)&p_Var43[0x43]._M_next =
                   local_8c * fVar59 +
                   local_90 * fVar58 + (float)uStack_98 * fVar57 + uStack_98._4_4_ * fVar56;
              *(float *)((long)&p_Var43[0x43]._M_next + 4) =
                   fVar9 * local_7c + fVar8 * fStack_80 + fVar6 * fStack_88 + fVar5 * fStack_84;
              *(float *)&p_Var43[0x43]._M_prev =
                   fVar12 * local_7c + fVar11 * fStack_80 + fVar7 * fStack_88 + fVar10 * fStack_84;
              *(float *)((long)&p_Var43[0x43]._M_prev + 4) =
                   fVar64 * local_7c + fVar55 * fStack_80 + fVar54 * fStack_88 + fVar53 * fStack_84;
              *(float *)&p_Var43[0x44]._M_next =
                   fVar59 * local_7c + fVar58 * fStack_80 + fVar57 * fStack_88 + fStack_84 * fVar56;
              p_Var40 = (_List_node_base *)operator_new(0x18);
              p_Var40[1]._M_next = p_Var43;
              std::__detail::_List_node_base::_M_hook(p_Var40);
              local_68 = local_68 + 1;
              p_Var40 = p_Var41->_M_next;
              local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              _M_size = local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                        _M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var41);
              bVar52 = false;
            }
          }
          p_Var41 = p_Var40;
          if (bVar52) goto LAB_00163ee3;
        }
        else {
LAB_00163ee3:
          p_Var40 = p_Var41->_M_next;
        }
        p_Var41 = p_Var40;
      } while (p_Var40 != (_List_node_base *)&local_100);
    }
    nd = local_38;
    if ((p_Var39 != (_List_node_base *)0x0) && ((long ********)local_78 != &local_78)) {
      local_e8->count_merged = local_e8->count_merged + 1;
      iVar51 = 0;
      iVar36 = snprintf((char *)((long)&p_Var39->_M_next + 4),0x400,"$MergedNode_%i");
      ppppppplVar45 = local_78;
      *(int *)&p_Var39->_M_next = iVar36;
      if ((long ********)local_78 != &local_78) {
        iVar51 = 0;
        ppppppplVar42 = local_78;
        do {
          ppppppplVar3 = ppppppplVar42 + 2;
          ppppppplVar42 = (long *******)*ppppppplVar42;
          iVar51 = iVar51 + *(int *)(*ppppppplVar3 + 0x8c);
        } while ((long ********)ppppppplVar42 != &local_78);
      }
      if (iVar51 != 0) {
        p_Var43 = (_List_node_base *)
                  operator_new__((ulong)(uint)(*(int *)&p_Var39[0x46]._M_next + iVar51) << 2);
        p_Var41 = p_Var43;
        if (*(int *)&p_Var39[0x46]._M_next != 0) {
          lVar46 = 0;
          uVar49 = 0;
          do {
            *(undefined4 *)((long)&p_Var43->_M_next + uVar49 * 4) =
                 *(undefined4 *)((long)&(p_Var39[0x46]._M_prev)->_M_next + uVar49 * 4);
            uVar49 = uVar49 + 1;
            lVar46 = lVar46 + 4;
          } while (uVar49 < *(uint *)&p_Var39[0x46]._M_next);
          p_Var41 = (_List_node_base *)((long)&p_Var43->_M_next + lVar46);
        }
        for (; (long ********)ppppppplVar45 != &local_78;
            ppppppplVar45 = (long *******)*ppppppplVar45) {
          paVar48 = (aiNode *)ppppppplVar45[2];
          if (paVar48->mNumMeshes != 0) {
            uVar49 = 0;
            do {
              uVar25 = paVar48->mMeshes[uVar49];
              *(uint *)&p_Var41->_M_next = uVar25;
              pppppplVar26 = ppppppplVar45[2];
              fVar5 = *(float *)((long)pppppplVar26 + 0x404);
              fVar6 = *(float *)(pppppplVar26 + 0x81);
              fVar7 = *(float *)((long)pppppplVar26 + 0x414);
              fVar8 = *(float *)(pppppplVar26 + 0x83);
              fVar9 = *(float *)((long)pppppplVar26 + 0x41c);
              fVar10 = *(float *)((long)pppppplVar26 + 0x424);
              fVar11 = *(float *)(pppppplVar26 + 0x85);
              fVar12 = *(float *)((long)pppppplVar26 + 0x42c);
              local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,fVar5);
              local_d8 = ZEXT416((uint)fVar6);
              fVar54 = fVar7 * -fVar6;
              local_c0 = (LockedSetType *)CONCAT44(local_c0._4_4_,fVar7);
              fVar63 = -*(float *)((long)pppppplVar26 + 0x40c);
              fVar64 = fVar8 * fVar63 * fVar10 +
                       *(float *)((long)pppppplVar26 + 0x40c) * fVar7 * fVar11 +
                       fVar54 * fVar12 +
                       fVar6 * fVar9 * fVar10 + (fVar5 * fVar8 * fVar12 - fVar9 * fVar5 * fVar11);
              fVar62 = NAN;
              fVar53 = NAN;
              fVar56 = NAN;
              fVar57 = NAN;
              fVar55 = NAN;
              fVar58 = NAN;
              fVar59 = NAN;
              fVar60 = NAN;
              fVar61 = NAN;
              if ((fVar64 != 0.0) || (NAN(fVar64))) {
                fVar64 = 1.0 / fVar64;
                fVar53 = (fVar8 * fVar12 - fVar11 * fVar9) * fVar64;
                fVar57 = (fVar6 * fVar9 + fVar8 * fVar63) * fVar64;
                fVar58 = (fVar12 * fVar5 + fVar10 * fVar63) * fVar64;
                fVar60 = (fVar7 * fVar11 - fVar8 * fVar10) * fVar64;
                fVar62 = (fVar5 * fVar8 + fVar54) * fVar64;
                fVar64 = -fVar64;
                fVar56 = (fVar6 * fVar12 + fVar11 * fVar63) * fVar64;
                fVar55 = (fVar7 * fVar12 - fVar9 * fVar10) * fVar64;
                fVar59 = (fVar9 * fVar5 + fVar63 * fVar7) * fVar64;
                fVar61 = (fVar5 * fVar11 + -fVar6 * fVar10) * fVar64;
              }
              paVar27 = local_e8->mScene->mMeshes[uVar25];
              if (paVar27->mNumVertices != 0) {
                lVar46 = 8;
                uVar47 = 0;
                do {
                  pppppplVar26 = ppppppplVar45[2];
                  paVar28 = paVar27->mVertices;
                  fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                  fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                  fVar7 = *(float *)((long)&paVar28->x + lVar46);
                  fVar8 = *(float *)(pppppplVar26 + 0x85);
                  fVar9 = *(float *)((long)pppppplVar26 + 0x424);
                  fVar10 = *(float *)((long)pppppplVar26 + 0x42c);
                  fVar11 = *(float *)(pppppplVar26 + 0x86);
                  *(ulong *)((long)paVar28 + lVar46 + -8) =
                       CONCAT44(*(float *)((long)pppppplVar26 + 0x41c) * fVar7 +
                                *(float *)((long)pppppplVar26 + 0x414) * fVar5 +
                                *(float *)(pppppplVar26 + 0x83) * fVar6 +
                                *(float *)(pppppplVar26 + 0x84),
                                *(float *)((long)pppppplVar26 + 0x40c) * fVar7 +
                                *(float *)((long)pppppplVar26 + 0x404) * fVar5 +
                                *(float *)(pppppplVar26 + 0x81) * fVar6 +
                                *(float *)(pppppplVar26 + 0x82));
                  *(float *)((long)&paVar28->x + lVar46) =
                       fVar7 * fVar10 + fVar5 * fVar9 + fVar6 * fVar8 + fVar11;
                  paVar28 = paVar27->mNormals;
                  if ((paVar28 != (aiVector3D *)0x0) && (paVar27->mNumVertices != 0)) {
                    fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                    fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                    fVar7 = *(float *)((long)&paVar28->x + lVar46);
                    *(ulong *)((long)paVar28 + lVar46 + -8) =
                         CONCAT44(fVar61 * fVar7 + fVar56 * fVar5 + fVar58 * fVar6,
                                  fVar60 * fVar7 + fVar53 * fVar5 + fVar55 * fVar6);
                    *(float *)((long)&paVar28->x + lVar46) =
                         fVar7 * fVar62 + fVar5 * fVar57 + fVar6 * fVar59;
                  }
                  paVar28 = paVar27->mTangents;
                  if (((paVar28 != (aiVector3D *)0x0) && (paVar27->mBitangents != (aiVector3D *)0x0)
                      ) && (paVar27->mNumVertices != 0)) {
                    fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                    fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                    fVar7 = *(float *)((long)&paVar28->x + lVar46);
                    *(ulong *)((long)paVar28 + lVar46 + -8) =
                         CONCAT44(fVar61 * fVar7 + fVar56 * fVar5 + fVar58 * fVar6,
                                  fVar60 * fVar7 + fVar53 * fVar5 + fVar55 * fVar6);
                    *(float *)((long)&paVar28->x + lVar46) =
                         fVar7 * fVar62 + fVar5 * fVar57 + fVar6 * fVar59;
                    paVar28 = paVar27->mBitangents;
                    fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                    fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                    fVar7 = *(float *)((long)&paVar28->x + lVar46);
                    *(ulong *)((long)paVar28 + lVar46 + -8) =
                         CONCAT44(fVar61 * fVar7 + fVar56 * fVar5 + fVar58 * fVar6,
                                  fVar60 * fVar7 + fVar53 * fVar5 + fVar55 * fVar6);
                    *(float *)((long)&paVar28->x + lVar46) =
                         fVar7 * fVar62 + fVar5 * fVar57 + fVar6 * fVar59;
                  }
                  uVar47 = uVar47 + 1;
                  lVar46 = lVar46 + 0xc;
                } while (uVar47 < paVar27->mNumVertices);
              }
              p_Var41 = (_List_node_base *)((long)&p_Var41->_M_next + 4);
              uVar49 = uVar49 + 1;
              paVar48 = (aiNode *)ppppppplVar45[2];
            } while (uVar49 < paVar48->mNumMeshes);
          }
          if (paVar48 != (aiNode *)0x0) {
            aiNode::~aiNode(paVar48);
            operator_delete(paVar48);
          }
        }
        if (p_Var39[0x46]._M_prev != (_List_node_base *)0x0) {
          operator_delete__(p_Var39[0x46]._M_prev);
        }
        p_Var39[0x46]._M_prev = p_Var43;
        *(int *)&p_Var39[0x46]._M_next = *(int *)&p_Var39[0x46]._M_next + iVar51;
      }
    }
    pOVar50 = local_e8;
    ppppppplVar45 = local_78;
    while (local_e8 = pOVar50, (long ********)ppppppplVar45 != &local_78) {
      ppppppplVar42 = (long *******)*ppppppplVar45;
      operator_delete(ppppppplVar45);
      pOVar50 = local_e8;
      ppppppplVar45 = ppppppplVar42;
    }
  }
  if ((local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next == (_List_node_base *)&local_100) ||
     (nd->mNumChildren <
      local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size)) {
    if (nd->mChildren != (aiNode **)0x0) {
      operator_delete__(nd->mChildren);
    }
    if (local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_100) {
      ppaVar44 = (aiNode **)0x0;
    }
    else {
      ppaVar44 = (aiNode **)
                 operator_new__(-(ulong)(local_100.
                                         super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                         _M_impl._M_node._M_size >> 0x3d != 0) |
                                local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                _M_impl._M_node._M_size << 3);
    }
    nd->mChildren = ppaVar44;
  }
  nd->mNumChildren =
       (uint)local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
  ;
  ppaVar44 = nd->mChildren;
  p_Var39 = local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_100 && ppaVar44 != (aiNode **)0x0)
  {
    do {
      paVar48 = (aiNode *)p_Var39[1]._M_next;
      *ppaVar44 = paVar48;
      ppaVar44 = ppaVar44 + 1;
      paVar48->mParent = nd;
      p_Var39 = p_Var39->_M_next;
    } while (p_Var39 != (_List_node_base *)&local_100);
  }
  pOVar50->nodes_out =
       pOVar50->nodes_out +
       (uint)local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
  ;
LAB_00164d5a:
  p_Var39 = local_100.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  while (p_Var39 != (_List_node_base *)&local_100) {
    p_Var41 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var39->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
    operator_delete(p_Var39);
    p_Var39 = p_Var41;
  }
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode* nd, std::list<aiNode*>& nodes) {
    nodes_in += nd->mNumChildren;

    // Process children
    std::list<aiNode*> child_nodes;
    for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
        CollectNewChildren(nd->mChildren[i],child_nodes);
        nd->mChildren[i] = nullptr;
    }

    // Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
    if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end() ) {
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

            if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
                (*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
                nodes.push_back(*it);

                it = child_nodes.erase(it);
                continue;
            }
            ++it;
        }

        if (nd->mNumMeshes || !child_nodes.empty()) {
            nodes.push_back(nd);
        } else {
            delete nd; /* bye, node */
            return;
        }
    } else {

        // Retain our current position in the hierarchy
        nodes.push_back(nd);

        // Now check for possible optimizations in our list of child nodes. join as many as possible
        aiNode* join_master = NULL;
        aiMatrix4x4 inv;

        const LockedSetType::const_iterator end = locked.end();

        std::list<aiNode*> join;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();)   {
            aiNode* child = *it;
            if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

                // There may be no instanced meshes
                unsigned int n = 0;
                for (; n < child->mNumMeshes;++n) {
                    if (meshes[child->mMeshes[n]] > 1) {
                        break;
                    }
                }
                if (n == child->mNumMeshes) {
                    if (!join_master) {
                        join_master = child;
                        inv = join_master->mTransformation;
                        inv.Inverse();
                    } else {
                        child->mTransformation = inv * child->mTransformation ;

                        join.push_back(child);
                        it = child_nodes.erase(it);
                        continue;
                    }
                }
            }
            ++it;
        }
        if (join_master && !join.empty()) {
            join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i",count_merged++);

            unsigned int out_meshes = 0;
            for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                out_meshes += (*it)->mNumMeshes;
            }

            // copy all mesh references in one array
            if (out_meshes) {
                unsigned int* meshes = new unsigned int[out_meshes+join_master->mNumMeshes], *tmp = meshes;
                for (unsigned int n = 0; n < join_master->mNumMeshes;++n) {
                    *tmp++ = join_master->mMeshes[n];
                }

                for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                    for (unsigned int n = 0; n < (*it)->mNumMeshes; ++n) {

                        *tmp = (*it)->mMeshes[n];
                        aiMesh* mesh = mScene->mMeshes[*tmp++];

                        // manually move the mesh into the right coordinate system
                        const aiMatrix3x3 IT = aiMatrix3x3( (*it)->mTransformation ).Inverse().Transpose();
                        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

                            mesh->mVertices[a] *= (*it)->mTransformation;

                            if (mesh->HasNormals())
                                mesh->mNormals[a] *= IT;

                            if (mesh->HasTangentsAndBitangents()) {
                                mesh->mTangents[a] *= IT;
                                mesh->mBitangents[a] *= IT;
                            }
                        }
                    }
                    delete *it; // bye, node
                }
                delete[] join_master->mMeshes;
                join_master->mMeshes = meshes;
                join_master->mNumMeshes += out_meshes;
            }
        }
    }
    // reassign children if something changed
    if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

        delete[] nd->mChildren;

        if (!child_nodes.empty()) {
            nd->mChildren = new aiNode*[child_nodes.size()];
        }
        else nd->mChildren = nullptr;
    }

    nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

    if (nd->mChildren) {
        aiNode** tmp = nd->mChildren;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
            aiNode* node = *tmp++ = *it;
            node->mParent = nd;
        }
    }

    nodes_out += static_cast<unsigned int>(child_nodes.size());
}